

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxInfeas(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  int *piVar8;
  bool *pbVar9;
  pointer pnVar10;
  fpclass_type *pfVar11;
  int i_2;
  int32_t *piVar12;
  long lVar13;
  int i;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_f8;
  int32_t *local_a8;
  fpclass_type *local_a0;
  bool *local_98;
  int *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  if (this->theType == ENTER) {
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 0x10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[6] = 0;
      local_f8.data._M_elems[7] = 0;
      local_f8.data._M_elems[8] = 0;
      local_f8.data._M_elems[9] = 0;
      local_f8.data._M_elems[10] = 0;
      local_f8.data._M_elems[0xb] = 0;
      local_f8.data._M_elems[0xc] = 0;
      local_f8.data._M_elems[0xd] = 0;
      local_f8.data._M_elems._56_5_ = 0;
      local_f8.data._M_elems[0xf]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_f8,&(this->m_pricingViol).m_backend,&(this->m_pricingViolCo).m_backend);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           local_f8.data._M_elems._48_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           local_f8.data._M_elems._32_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
           local_f8.data._M_elems._40_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_f8.data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           local_f8.data._M_elems._24_8_;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_f8.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_f8.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_f8.exp;
      (__return_storage_ptr__->m_backend).neg = local_f8.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_f8.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_f8.prec_elem;
    }
    local_90 = &(__return_storage_ptr__->m_backend).exp;
    local_98 = &(__return_storage_ptr__->m_backend).neg;
    local_a0 = &(__return_storage_ptr__->m_backend).fpclass;
    local_a8 = &(__return_storage_ptr__->m_backend).prec_elem;
    lVar14 = 0;
    for (lVar13 = 0; lVar13 < (this->thecovectors->set).thenum; lVar13 = lVar13 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->theFvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theUBbound).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar14));
      if (tVar7) {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&((this->theFvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14),
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&(((this->theUBbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar14));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88);
        if (tVar7) {
LAB_002e0c9c:
          local_f8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_f8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_f8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          local_f8.data._M_elems._24_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_f8.data._M_elems._32_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_f8.data._M_elems._40_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
          local_f8.data._M_elems._48_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
          local_f8.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_90;
          pbVar9 = local_98;
          pfVar11 = local_a0;
          piVar12 = local_a8;
        }
        else {
          pnVar5 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002e0ce8:
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 0x10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems[6] = 0;
          local_f8.data._M_elems[7] = 0;
          local_f8.data._M_elems[8] = 0;
          local_f8.data._M_elems[9] = 0;
          local_f8.data._M_elems[10] = 0;
          local_f8.data._M_elems[0xb] = 0;
          local_f8.data._M_elems[0xc] = 0;
          local_f8.data._M_elems[0xd] = 0;
          local_f8.data._M_elems._56_5_ = 0;
          local_f8.data._M_elems[0xf]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_f8,
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar14),
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar14));
          piVar8 = &local_f8.exp;
          pbVar9 = &local_f8.neg;
          pfVar11 = &local_f8.fpclass;
          piVar12 = &local_f8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_f8.data._M_elems._48_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_f8.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_f8.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_f8.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_f8.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_f8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_f8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->theFvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theLBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar14));
        if (tVar7) {
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_88,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((this->theLBbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar14)
                     ,(cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->theFvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_88);
          if (tVar7) goto LAB_002e0c9c;
          pnVar5 = (this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_002e0ce8;
        }
      }
      lVar14 = lVar14 + 0x50;
    }
  }
  else {
    if (this->m_pricingViolUpToDate != false) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&__return_storage_ptr__->m_backend,&(this->m_pricingViol).m_backend);
    }
    local_90 = &(__return_storage_ptr__->m_backend).exp;
    local_98 = &(__return_storage_ptr__->m_backend).neg;
    local_a0 = &(__return_storage_ptr__->m_backend).fpclass;
    local_a8 = &(__return_storage_ptr__->m_backend).prec_elem;
    lVar13 = 0;
    for (lVar14 = 0; lVar14 < (this->thecovectors->set).thenum; lVar14 = lVar14 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->theCoPvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theCoUbound->val).
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar13));
      if (tVar7) {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&((this->theCoPvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13),
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&(((this->theCoUbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88);
        if (tVar7) {
LAB_002e07b2:
          local_f8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_f8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_f8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          local_f8.data._M_elems._24_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_f8.data._M_elems._32_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_f8.data._M_elems._40_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
          local_f8.data._M_elems._48_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
          local_f8.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_90;
          pbVar9 = local_98;
          pfVar11 = local_a0;
          piVar12 = local_a8;
        }
        else {
          pnVar5 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theCoUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002e0801:
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 0x10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems[6] = 0;
          local_f8.data._M_elems[7] = 0;
          local_f8.data._M_elems[8] = 0;
          local_f8.data._M_elems[9] = 0;
          local_f8.data._M_elems[10] = 0;
          local_f8.data._M_elems[0xb] = 0;
          local_f8.data._M_elems[0xc] = 0;
          local_f8.data._M_elems[0xd] = 0;
          local_f8.data._M_elems._56_5_ = 0;
          local_f8.data._M_elems[0xf]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_f8,
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar13),
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar13));
          piVar8 = &local_f8.exp;
          pbVar9 = &local_f8.neg;
          pfVar11 = &local_f8.fpclass;
          piVar12 = &local_f8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_f8.data._M_elems._48_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_f8.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_f8.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_f8.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_f8.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_f8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_f8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->theCoPvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theCoLbound->val).
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar13));
        if (tVar7) {
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_88,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((this->theCoLbound->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13)
                     ,(cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->theCoPvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_88);
          if (tVar7) goto LAB_002e07b2;
          pnVar5 = (this->theCoLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_002e0801;
        }
      }
      lVar13 = lVar13 + 0x50;
    }
    lVar13 = 0;
    for (lVar14 = 0; lVar14 < (this->thevectors->set).thenum; lVar14 = lVar14 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->thePvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theUbound->val).
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar13));
      if (tVar7) {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&((this->thePvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13),
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)&(((this->theUbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88);
        if (tVar7) {
LAB_002e09d4:
          local_f8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_f8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_f8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          local_f8.data._M_elems._24_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_f8.data._M_elems._32_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_f8.data._M_elems._40_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
          local_f8.data._M_elems._48_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
          local_f8.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_90;
          pbVar9 = local_98;
          pfVar11 = local_a0;
          piVar12 = local_a8;
        }
        else {
          pnVar5 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002e0a23:
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 0x10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems[6] = 0;
          local_f8.data._M_elems[7] = 0;
          local_f8.data._M_elems[8] = 0;
          local_f8.data._M_elems[9] = 0;
          local_f8.data._M_elems[10] = 0;
          local_f8.data._M_elems[0xb] = 0;
          local_f8.data._M_elems[0xc] = 0;
          local_f8.data._M_elems[0xd] = 0;
          local_f8.data._M_elems._56_5_ = 0;
          local_f8.data._M_elems[0xf]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_f8,
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar13),
                     (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar13));
          piVar8 = &local_f8.exp;
          pbVar9 = &local_f8.neg;
          pfVar11 = &local_f8.fpclass;
          piVar12 = &local_f8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_f8.data._M_elems._48_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_f8.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_f8.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_f8.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_f8.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_f8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_f8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->thePvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theLbound->val).
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar13));
        if (tVar7) {
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_88,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((this->theLbound->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13)
                     ,(cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->thePvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_88);
          if (tVar7) goto LAB_002e09d4;
          pnVar5 = (this->theLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_002e0a23;
        }
      }
      lVar13 = lVar13 + 0x50;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }